

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.c
# Opt level: O0

void tga_read_rle_indexed(image_data *im,sptr_t data)

{
  int iVar1;
  uchar *__src;
  sptr_t sVar2;
  uchar *local_50;
  size_t local_48;
  int local_3c;
  int run_count;
  int pixel_count;
  uchar *d;
  uchar *p;
  uchar b;
  int i;
  image_data *im_local;
  sptr_t data_local;
  
  d = data.ptr;
  local_3c = 0;
  sVar2 = sptr_xmalloc((ulong)(im->width * im->height));
  local_50 = sVar2.ptr;
  (im->pixels).ptr = local_50;
  local_48 = sVar2.size;
  (im->pixels).size = local_48;
  _run_count = (im->pixels).ptr;
  for (; (ulong)(long)local_3c < (im->pixels).size; local_3c = iVar1 + local_3c) {
    iVar1 = (*d & 0xffffff7f) + 1;
    __src = d + 1;
    if ((*d & 0x80) == 0) {
      memcpy(_run_count,__src,(long)iVar1);
      _run_count = _run_count + iVar1;
      d = __src + iVar1;
    }
    else {
      for (p._4_4_ = 0; p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
        *_run_count = *__src;
        _run_count = _run_count + 1;
      }
      d = d + 2;
    }
  }
  return;
}

Assistant:

static void tga_read_rle_indexed(struct image_data *im, const sptr_t data)
{
	int i;
	unsigned char b;
	unsigned char *p = data.ptr;
	unsigned char *d;
	int pixel_count = 0;
	int run_count = 0;
	im->pixels = sptr_xmalloc(im->width * im->height);
	d = im->pixels.ptr;
	while (pixel_count < im->pixels.size) {
		b = *p;
		run_count = (b & ~128) + 1;
		p++;
		if (b & 128) { // RLE packet
			for (i = 0; i < run_count; i++) {
				*d = *p;
				d++;
			}
			p++;
		} else { // raw packet
			memcpy(d, p, run_count);
			d += run_count;
			p += run_count;
		}
		pixel_count += run_count;
	}
}